

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_transaction.cpp
# Opt level: O2

void __thiscall
duckdb::DuckTransaction::DuckTransaction
          (DuckTransaction *this,DuckTransactionManager *manager,ClientContext *context_p,
          transaction_t start_time,transaction_t transaction_id,idx_t catalog_version_p)

{
  Transaction::Transaction(&this->super_Transaction,&manager->super_TransactionManager,context_p);
  (this->super_Transaction)._vptr_Transaction = (_func_int **)&PTR__DuckTransaction_027a12f0;
  this->start_time = start_time;
  this->transaction_id = transaction_id;
  this->commit_id = 0;
  this->highest_active_query = 0;
  (this->catalog_version).super___atomic_base<unsigned_long>._M_i = catalog_version_p;
  this->awaiting_cleanup = false;
  this->transaction_manager = manager;
  UndoBuffer::UndoBuffer(&this->undo_buffer,this,context_p);
  make_uniq<duckdb::LocalStorage,duckdb::ClientContext&,duckdb::DuckTransaction&>
            ((duckdb *)&this->storage,context_p,this);
  (this->sequence_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->sequence_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->sequence_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->sequence_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->write_lock).
  super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>._M_t.
  super___uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>.
  super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl = (StorageLockKey *)0x0;
  (this->sequence_lock).super___mutex_base._M_mutex.__align = 0;
  (this->sequence_usage)._M_h._M_buckets = &(this->sequence_usage)._M_h._M_single_bucket;
  (this->sequence_usage)._M_h._M_bucket_count = 1;
  (this->sequence_usage)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->sequence_usage)._M_h._M_element_count = 0;
  (this->sequence_usage)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->sequence_usage)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->sequence_usage)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->modified_tables)._M_h._M_buckets = &(this->modified_tables)._M_h._M_single_bucket;
  (this->modified_tables)._M_h._M_bucket_count = 1;
  (this->modified_tables)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->modified_tables)._M_h._M_element_count = 0;
  (this->modified_tables)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->modified_tables)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->modified_tables)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->active_locks_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->active_locks_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->active_locks_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->active_locks_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->active_locks_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->active_locks)._M_h._M_buckets = &(this->active_locks)._M_h._M_single_bucket;
  (this->active_locks)._M_h._M_bucket_count = 1;
  (this->active_locks)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->active_locks)._M_h._M_element_count = 0;
  (this->active_locks)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->active_locks)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->active_locks)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

DuckTransaction::DuckTransaction(DuckTransactionManager &manager, ClientContext &context_p, transaction_t start_time,
                                 transaction_t transaction_id, idx_t catalog_version_p)
    : Transaction(manager, context_p), start_time(start_time), transaction_id(transaction_id), commit_id(0),
      highest_active_query(0), catalog_version(catalog_version_p), awaiting_cleanup(false),
      transaction_manager(manager), undo_buffer(*this, context_p), storage(make_uniq<LocalStorage>(context_p, *this)) {
}